

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O2

Vec_Int_t * Wlc_NtkGetBlacks(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Bit_t *p_01;
  Wlc_Obj_t *pWVar4;
  int Id;
  uint uVar5;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Wlc_NtkMarkLimit(p,pPars);
  local_38 = 0;
  Id = 1;
  local_34 = 0;
  local_3c = 0;
  local_40 = 0;
  uVar5 = 0;
  do {
    if (p->iObj <= Id) {
      if (p_01 != (Vec_Bit_t *)0x0) {
        Vec_BitFree(p_01);
      }
      if (pPars->fVerbose != 0) {
        printf("Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away (out of %d signals).\n"
               ,(ulong)local_38,(ulong)local_34,(ulong)local_3c,(ulong)local_40,(ulong)uVar5);
      }
      return p_00;
    }
    pWVar4 = Wlc_NtkObj(p,Id);
    uVar1 = *(ushort *)pWVar4 & 0x3f;
    if (uVar1 < 0x33) {
      if ((0x1e00000000000U >> uVar1 & 1) == 0) {
        if ((0x4180000000000U >> uVar1 & 1) == 0) {
          if (uVar1 != 8) goto LAB_006d5985;
          iVar2 = pWVar4->End - pWVar4->Beg;
          iVar3 = -iVar2;
          if (0 < iVar2) {
            iVar3 = iVar2;
          }
          if (pPars->nBitsMux <= iVar3 + 1) {
            uVar5 = uVar5 + 1;
            if (p_01 != (Vec_Bit_t *)0x0) {
              iVar3 = Vec_BitEntry(p_01,Id);
              if (iVar3 == 0) goto LAB_006d59ef;
            }
            Vec_IntPushUniqueOrder(p_00,(int)(((long)pWVar4 - (long)p->pObjs) / 0x18));
            local_3c = local_3c + 1;
          }
        }
        else {
          iVar2 = pWVar4->End - pWVar4->Beg;
          iVar3 = -iVar2;
          if (0 < iVar2) {
            iVar3 = iVar2;
          }
          if (pPars->nBitsAdd <= iVar3 + 1) {
            uVar5 = uVar5 + 1;
            if (p_01 != (Vec_Bit_t *)0x0) {
              iVar3 = Vec_BitEntry(p_01,Id);
              if (iVar3 == 0) goto LAB_006d59ef;
            }
            Vec_IntPushUniqueOrder(p_00,(int)(((long)pWVar4 - (long)p->pObjs) / 0x18));
            local_38 = local_38 + 1;
          }
        }
      }
      else {
        iVar2 = pWVar4->End - pWVar4->Beg;
        iVar3 = -iVar2;
        if (0 < iVar2) {
          iVar3 = iVar2;
        }
        if (pPars->nBitsMul <= iVar3 + 1) {
          uVar5 = uVar5 + 1;
          if (p_01 != (Vec_Bit_t *)0x0) {
            iVar3 = Vec_BitEntry(p_01,Id);
            if (iVar3 == 0) goto LAB_006d59ef;
          }
          Vec_IntPushUniqueOrder(p_00,(int)(((long)pWVar4 - (long)p->pObjs) / 0x18));
          local_34 = local_34 + 1;
        }
      }
    }
    else {
LAB_006d5985:
      if ((short)uVar1 != 1 && (*(ushort *)pWVar4 & 0x3d) == 1) {
        iVar2 = pWVar4->End - pWVar4->Beg;
        iVar3 = -iVar2;
        if (0 < iVar2) {
          iVar3 = iVar2;
        }
        if (pPars->nBitsFlop <= iVar3 + 1) {
          uVar5 = uVar5 + 1;
          if (p_01 != (Vec_Bit_t *)0x0) {
            iVar3 = Vec_BitEntry(p_01,Id);
            if (iVar3 == 0) goto LAB_006d59ef;
          }
          pWVar4 = Wlc_ObjFo2Fi(p,pWVar4);
          Vec_IntPushUniqueOrder(p_00,(int)(((long)pWVar4 - (long)p->pObjs) / 0x18));
          local_40 = local_40 + 1;
        }
      }
    }
LAB_006d59ef:
    Id = Id + 1;
  } while( true );
}

Assistant:

static Vec_Int_t * Wlc_NtkGetBlacks( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    Vec_Int_t * vBlacks = Vec_IntAlloc( 100 ) ;
    Wlc_Obj_t * pObj; int i, Count[4] = {0};
    Vec_Bit_t * vMarks = NULL;
    int nTotal = 0;

    vMarks = Wlc_NtkMarkLimit( p, pPars ) ; 

    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( pObj->Type == WLC_OBJ_ARI_ADD || pObj->Type == WLC_OBJ_ARI_SUB || pObj->Type == WLC_OBJ_ARI_MINUS )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsAdd )
            {
                ++nTotal;
                if ( vMarks == NULL )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[0]++;
                else if ( Vec_BitEntry( vMarks, i ) )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[0]++;
            }
            continue;
        }
        if ( pObj->Type == WLC_OBJ_ARI_MULTI || pObj->Type == WLC_OBJ_ARI_DIVIDE || pObj->Type == WLC_OBJ_ARI_REM || pObj->Type == WLC_OBJ_ARI_MODULUS )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsMul )
            {
                ++nTotal;
                if ( vMarks == NULL )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[1]++;
                else if ( Vec_BitEntry( vMarks, i ) )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[1]++;
            }
            continue;
        }
        if ( pObj->Type == WLC_OBJ_MUX )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsMux )
            {
                ++nTotal;
                if ( vMarks == NULL )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[2]++;
                else if ( Vec_BitEntry( vMarks, i ) )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[2]++;
            }
            continue;
        }
        if ( Wlc_ObjIsCi(pObj) && !Wlc_ObjIsPi(pObj) )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsFlop )
            {
                ++nTotal;
                if ( vMarks == NULL )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId( p, Wlc_ObjFo2Fi( p, pObj ) ) ), Count[3]++;
                else if ( Vec_BitEntry( vMarks, i ) )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId( p, Wlc_ObjFo2Fi( p, pObj ) ) ), Count[3]++;
            }
            continue;
        }
    }
    if ( vMarks )
        Vec_BitFree( vMarks );
    if ( pPars->fVerbose )
        printf( "Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away (out of %d signals).\n", Count[0], Count[1], Count[2], Count[3], nTotal );
    return vBlacks;
}